

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O3

void __thiscall smf::MidiMessage::makePitchBendDouble(MidiMessage *this,int channel,double value)

{
  pointer *ppuVar1;
  iterator iVar2;
  byte bVar3;
  uint uVar4;
  byte bVar5;
  double dVar6;
  double dVar7;
  uchar msb;
  uchar lsb;
  byte local_2b;
  byte local_2a;
  byte local_29;
  double local_28;
  
  local_28 = value;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,0);
  dVar6 = (local_28 + 1.0) * 32768.0;
  dVar7 = 0.0;
  if (0.0 <= dVar6) {
    dVar7 = dVar6;
  }
  dVar6 = 32767.0;
  if (dVar7 <= 32767.0) {
    dVar6 = dVar7;
  }
  uVar4 = (uint)(long)(dVar6 - 9.223372036854776e+18) & (uint)((long)dVar6 >> 0x3f) |
          (uint)(long)dVar6;
  bVar5 = (byte)uVar4 & 0x7f;
  bVar3 = (byte)(uVar4 >> 7) & 0x7f;
  local_2b = (byte)channel | 0xe0;
  iVar2._M_current =
       (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_2a = bVar3;
  local_29 = bVar5;
  if (iVar2._M_current ==
      (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
              (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,iVar2,&local_2b);
    iVar2._M_current =
         (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar2._M_current = local_2b;
    iVar2._M_current =
         (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  if (iVar2._M_current ==
      (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_realloc_insert<unsigned_char_const&>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,iVar2,&local_29);
    iVar2._M_current =
         (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar2._M_current = bVar5;
    iVar2._M_current =
         (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  if (iVar2._M_current ==
      (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_realloc_insert<unsigned_char_const&>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,iVar2,&local_2a);
  }
  else {
    *iVar2._M_current = bVar3;
    ppuVar1 = &(this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  return;
}

Assistant:

void MidiMessage::makePitchBendDouble(int channel, double value) {
	// value is in the range from -1 for minimum and 2^18 - 1 for the maximum
	resize(0);
	double dvalue = (value + 1.0) * (pow(2.0, 15.0));
	if (dvalue < 0.0) {
		dvalue = 0.0;
	}
	if (dvalue > pow(2.0, 15.0) - 1.0) {
		dvalue = pow(2.0, 15.0) - 1.0;
	}
	ulong uivalue = (ulong)dvalue;
	uchar lsb = uivalue & 0x7f;
	uchar msb = (uivalue >> 7) & 0x7f;
	push_back(0xe0 | (0x7f & channel));
	push_back(lsb);
	push_back(msb);
}